

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

shared_ptr<dap::ReaderWriter> __thiscall dap::file(dap *this,FILE *f,bool closable)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<dap::ReaderWriter> sVar1;
  shared_ptr<(anonymous_namespace)::File> local_30;
  undefined1 local_19;
  FILE *pFStack_18;
  bool closable_local;
  FILE *f_local;
  
  local_19 = closable;
  pFStack_18 = f;
  f_local = (FILE *)this;
  std::make_shared<(anonymous_namespace)::File,_IO_FILE*&,bool&>
            ((_IO_FILE **)&local_30,(bool *)&stack0xffffffffffffffe8);
  std::shared_ptr<dap::ReaderWriter>::shared_ptr<(anonymous_namespace)::File,void>
            ((shared_ptr<dap::ReaderWriter> *)this,&local_30);
  std::shared_ptr<(anonymous_namespace)::File>::~shared_ptr(&local_30);
  sVar1.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<dap::ReaderWriter>)
         sVar1.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ReaderWriter> file(FILE* f, bool closable /* = true */) {
  return std::make_shared<File>(f, closable);
}